

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
          (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,char rhs)

{
  char in_stack_ffffffffffffffdf;
  long in_stack_ffffffffffffffe0;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  BinaryAndHelper<long,_char,_1>::And(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_8,(long *)&stack0xffffffffffffffe0);
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator &( U rhs ) const SAFEINT_NOTHROW
    {
        // we want to avoid setting bits by surprise
        // consider the case of lhs = int, value = 0xffffffff
        //                      rhs = char, value = 0xff
        //
        // programmer intent is to get only the lower 8 bits
        // normal behavior is to upcast both sides to an int
        // which then sign extends rhs, setting all the bits

        // If you land in the assert, this is because the bitwise operator
        // was causing unexpected behavior. Fix is to properly cast your inputs
        // so that it works like you meant, not unexpectedly

        return SafeInt< T, E >( BinaryAndHelper< T, U, BinaryMethod< T, U >::method >::And( m_int, rhs ) );
    }